

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lexer.cpp
# Opt level: O1

shared_ptr<TokenStream> __thiscall
TokenStream::tokenize(TokenStream *this,ProgramContext *program,string *data_,char *stream_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  char cVar3;
  undefined8 uVar4;
  ProgramContext *pPVar5;
  _Alloc_hider _Var6;
  size_type sVar7;
  TokenStream *this_00;
  int iVar8;
  const_iterator cVar9;
  byte *pbVar10;
  ulong uVar11;
  byte *pbVar12;
  TokenStream *this_01;
  byte *pbVar13;
  undefined8 uVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  size_type __rlen;
  byte *pbVar16;
  byte *pbVar17;
  bool bVar18;
  long lVar19;
  _Alloc_hider _Var20;
  long lVar21;
  uint uVar22;
  byte *pbVar23;
  byte *pbVar24;
  _Rb_tree_header *p_Var25;
  _Alloc_hider _Var26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  shared_ptr<TokenStream> sVar30;
  optional<std::pair<const_char_*,_size_t>_> opt_first_token_1;
  size_t tok_begin;
  vector<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
  tokens;
  optional<std::pair<const_char_*,_size_t>_> opt_command;
  optional<std::pair<const_char_*,_size_t>_> next_token;
  LexerContext lexer;
  undefined1 local_270 [24];
  byte *local_258;
  byte *local_250;
  optional<std::pair<const_char_*,_size_t>_> local_248;
  size_t local_228;
  optional<std::pair<const_char_*,_size_t>_> local_220;
  char local_208;
  byte *local_200;
  byte *pbStack_1f8;
  LexerContext local_1f0;
  byte *local_128;
  string local_120;
  ProgramContext *local_100;
  long local_f8;
  byte *local_f0;
  TokenStream *local_e8;
  byte *local_e0;
  byte *local_d8;
  byte *local_d0;
  vector<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_> local_c8;
  string local_b0;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  pointer local_50;
  pointer puStack_48;
  pointer local_40;
  size_t sStack_38;
  
  local_120._M_dataplus._M_p = (data_->_M_dataplus)._M_p;
  paVar1 = &data_->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p == paVar1) {
    local_120.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_120.field_2._8_8_ = *(undefined8 *)((long)&data_->field_2 + 8);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  }
  else {
    local_120.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_120._M_string_length = data_->_M_string_length;
  (data_->_M_dataplus)._M_p = (pointer)paVar1;
  data_->_M_string_length = 0;
  (data_->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,stream_name,(allocator<char> *)local_270);
  LexerContext::LexerContext(&local_1f0,program,&local_120,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_100 = program;
  local_e8 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (local_1f0.stream.data._M_string_length == 0) {
LAB_001947e4:
    LexerContext::verify_nesting(&local_1f0);
    this_00 = local_e8;
    if (local_1f0.any_error == false) {
      this_01 = (TokenStream *)operator_new(0x90);
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_1f0.stream.stream_name._M_dataplus._M_p,
                 local_1f0.stream.stream_name._M_dataplus._M_p +
                 local_1f0.stream.stream_name._M_string_length);
      local_70._M_p = (pointer)&local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_1f0.stream.data._M_dataplus._M_p,
                 local_1f0.stream.data._M_dataplus._M_p + local_1f0.stream.data._M_string_length);
      local_50 = local_1f0.stream.line_offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      puStack_48 = local_1f0.stream.line_offset.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      local_40 = local_1f0.stream.line_offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      sStack_38 = local_1f0.stream.max_offset;
      local_1f0.stream.line_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f0.stream.line_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f0.stream.line_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c8.super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_1f0.tokens.
           super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_c8.super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_1f0.tokens.
           super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_c8.super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1f0.tokens.
           super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1f0.tokens.
      super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f0.tokens.
      super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f0.tokens.
      super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      TokenStream(this_01,local_100,(TextStream *)local_90,&local_c8);
      std::__shared_ptr<TokenStream,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<TokenStream,void>
                ((__shared_ptr<TokenStream,(__gnu_cxx::_Lock_policy)2> *)this_00,this_01);
      _Var15._M_pi = extraout_RDX_00;
      if (local_c8.
          super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.
                        super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        _Var15._M_pi = extraout_RDX_01;
      }
      if (local_50 != (pointer)0x0) {
        operator_delete(local_50,(long)local_40 - (long)local_50);
        _Var15._M_pi = extraout_RDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
        _Var15._M_pi = extraout_RDX_03;
      }
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        _Var15._M_pi = extraout_RDX_04;
      }
    }
    else {
      (local_e8->super_enable_shared_from_this<TokenStream>)._M_weak_this.
      super___weak_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (local_e8->super_enable_shared_from_this<TokenStream>)._M_weak_this.
      super___weak_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var15._M_pi = extraout_RDX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.line_buffer._M_dataplus._M_p != &local_1f0.line_buffer.field_2) {
      operator_delete(local_1f0.line_buffer._M_dataplus._M_p,
                      local_1f0.line_buffer.field_2._M_allocated_capacity + 1);
      _Var15._M_pi = extraout_RDX_05;
    }
    if (local_1f0.tokens.
        super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.tokens.
                      super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f0.tokens.
                            super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.tokens.
                            super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      _Var15._M_pi = extraout_RDX_06;
    }
    if (local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      _Var15._M_pi = extraout_RDX_07;
    }
    if (local_1f0.stream.line_offset.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.stream.line_offset.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f0.stream.line_offset.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.stream.line_offset.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      _Var15._M_pi = extraout_RDX_08;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.stream.data._M_dataplus._M_p != &local_1f0.stream.data.field_2) {
      operator_delete(local_1f0.stream.data._M_dataplus._M_p,
                      local_1f0.stream.data.field_2._M_allocated_capacity + 1);
      _Var15._M_pi = extraout_RDX_09;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.stream.stream_name._M_dataplus._M_p != &local_1f0.stream.stream_name.field_2) {
      operator_delete(local_1f0.stream.stream_name._M_dataplus._M_p,
                      local_1f0.stream.stream_name.field_2._M_allocated_capacity + 1);
      _Var15._M_pi = extraout_RDX_10;
    }
    sVar30.super___shared_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var15._M_pi;
    sVar30.super___shared_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
    return (shared_ptr<TokenStream>)
           sVar30.super___shared_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>;
  }
  pbVar23 = (byte *)(local_1f0.stream.data._M_dataplus._M_p + local_1f0.stream.data._M_string_length
                    );
  local_f8 = -(long)local_1f0.stream.data._M_dataplus._M_p;
  local_d8 = (byte *)local_1f0.stream.data._M_dataplus._M_p;
  _Var26._M_p = local_1f0.stream.data._M_dataplus._M_p;
  local_128 = pbVar23;
LAB_00192b2f:
  local_270[0] = (allocator<char>)0xa;
  local_d0 = (byte *)std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                               (_Var26._M_p,pbVar23,local_270);
  local_258 = (byte *)_Var26._M_p + -(long)local_d8;
  local_228 = (long)local_d0 - (long)local_d8;
  std::__cxx11::string::replace
            ((ulong)&local_1f0.line_buffer,0,(char *)local_1f0.line_buffer._M_string_length,
             (ulong)_Var26._M_p);
  sVar7 = local_1f0.line_buffer._M_string_length;
  _Var6._M_p = local_1f0.line_buffer._M_dataplus._M_p;
  pbVar24 = (byte *)(local_1f0.line_buffer._M_dataplus._M_p + local_1f0.line_buffer._M_string_length
                    );
  if ((char *)local_1f0.line_buffer._M_string_length != (char *)0x0) {
    bVar27 = false;
    _Var20._M_p = local_1f0.line_buffer._M_dataplus._M_p;
    do {
      bVar2 = *_Var20._M_p;
      if (local_1f0.comment_nest_level == 0 && bVar2 == 0x22) {
        bVar27 = (bool)(bVar27 ^ 1);
      }
      else {
        pbVar17 = (byte *)_Var20._M_p + 1;
        if ((pbVar17 != pbVar24) && (!bVar27)) {
          if (bVar2 == 0x2a) {
            if (*pbVar17 == 0x2f) {
              if (local_1f0.comment_nest_level != 0) {
                local_1f0.comment_nest_level = local_1f0.comment_nest_level - 1;
                goto LAB_00192c28;
              }
              local_1f0.any_error = true;
              local_270._16_8_ = local_258 + ((long)_Var20._M_p - (long)_Var6._M_p) + 1;
              local_270._8_8_ = local_258 + ((long)_Var20._M_p - (long)_Var6._M_p);
              local_270._0_8_ = &local_1f0.stream;
              local_250 = (byte *)_Var26._M_p;
              ProgramContext::error<TokenStream::TokenInfo>
                        (local_1f0.program,(TokenInfo *)local_270,"no comment to close");
              _Var20._M_p = (pointer)pbVar17;
              _Var26._M_p = (pointer)local_250;
            }
          }
          else if (bVar2 == 0x2f) {
            if (*pbVar17 == 0x2a) {
              local_1f0.comment_nest_level = local_1f0.comment_nest_level + 1;
LAB_00192c28:
              ((byte *)_Var20._M_p)[0] = 0x20;
              ((byte *)_Var20._M_p)[1] = 0x20;
              _Var20._M_p = (pointer)pbVar17;
            }
            else if (*pbVar17 == 0x2f) {
              memset(_Var20._M_p,0x20,(long)pbVar24 - (long)_Var20._M_p);
              break;
            }
          }
        }
      }
      if (local_1f0.comment_nest_level != 0) {
        *_Var20._M_p = 0x20;
      }
      _Var20._M_p = _Var20._M_p + 1;
    } while ((byte *)_Var20._M_p != pbVar24);
  }
  pbVar17 = (byte *)(local_1f0.line_buffer._M_dataplus._M_p + local_1f0.line_buffer._M_string_length
                    );
  _Var20._M_p = local_1f0.line_buffer._M_dataplus._M_p;
  if (0 < (long)local_1f0.line_buffer._M_string_length >> 2) {
    _Var20._M_p = local_1f0.line_buffer._M_dataplus._M_p +
                  (local_1f0.line_buffer._M_string_length & 0xfffffffffffffffc);
    lVar19 = ((long)local_1f0.line_buffer._M_string_length >> 2) + 1;
    pbVar16 = (byte *)(local_1f0.line_buffer._M_dataplus._M_p + 3);
    do {
      if ((pbVar16[-3] != 0x20) && (pbVar16[-3] != 9)) {
        pbVar16 = pbVar16 + -3;
        goto LAB_00192da7;
      }
      if ((pbVar16[-2] != 0x20) && (pbVar16[-2] != 9)) {
        pbVar16 = pbVar16 + -2;
        goto LAB_00192da7;
      }
      if ((pbVar16[-1] != 0x20) && (pbVar16[-1] != 9)) {
        pbVar16 = pbVar16 + -1;
        goto LAB_00192da7;
      }
      if ((*pbVar16 != 0x20) && (*pbVar16 != 9)) goto LAB_00192da7;
      lVar19 = lVar19 + -1;
      pbVar16 = pbVar16 + 4;
    } while (1 < lVar19);
  }
  lVar19 = (long)pbVar17 - (long)_Var20._M_p;
  if (lVar19 == 1) {
LAB_00192d7b:
    pbVar16 = pbVar17;
    if ((*_Var20._M_p != 0x20) && (pbVar16 = (byte *)_Var20._M_p, *_Var20._M_p == 9)) {
      pbVar16 = pbVar17;
    }
  }
  else if (lVar19 == 2) {
LAB_00192d6b:
    if ((*_Var20._M_p == 0x20) || (pbVar16 = (byte *)_Var20._M_p, *_Var20._M_p == 9)) {
      _Var20._M_p = _Var20._M_p + 1;
      goto LAB_00192d7b;
    }
  }
  else {
    pbVar16 = pbVar17;
    if ((lVar19 == 3) &&
       ((*_Var20._M_p == 0x20 || (pbVar16 = (byte *)_Var20._M_p, *_Var20._M_p == 9)))) {
      _Var20._M_p = _Var20._M_p + 1;
      goto LAB_00192d6b;
    }
  }
LAB_00192da7:
  if ((pbVar16 == pbVar17) || (*pbVar16 != 0x23)) {
    if (local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish[-1] == '\0') goto LAB_001944c1;
    _Var20._M_p = _Var6._M_p;
    if (0 < (long)sVar7 >> 2) {
      _Var20._M_p = _Var6._M_p + (sVar7 & 0xfffffffffffffffc);
      lVar19 = ((long)sVar7 >> 2) + 1;
      pbVar17 = (byte *)(_Var6._M_p + 3);
      do {
        if ((0x2c < (ulong)pbVar17[-3]) ||
           ((0x130100002200U >> ((ulong)pbVar17[-3] & 0x3f) & 1) == 0)) {
          pbVar17 = pbVar17 + -3;
          goto LAB_00192fd9;
        }
        if ((0x2c < (ulong)pbVar17[-2]) ||
           ((0x130100002200U >> ((ulong)pbVar17[-2] & 0x3f) & 1) == 0)) {
          pbVar17 = pbVar17 + -2;
          goto LAB_00192fd9;
        }
        if ((0x2c < (ulong)pbVar17[-1]) ||
           ((0x130100002200U >> ((ulong)pbVar17[-1] & 0x3f) & 1) == 0)) {
          pbVar17 = pbVar17 + -1;
          goto LAB_00192fd9;
        }
        if ((0x2c < (ulong)*pbVar17) || ((0x130100002200U >> ((ulong)*pbVar17 & 0x3f) & 1) == 0))
        goto LAB_00192fd9;
        lVar19 = lVar19 + -1;
        pbVar17 = pbVar17 + 4;
      } while (1 < lVar19);
    }
    lVar19 = (long)pbVar24 - (long)_Var20._M_p;
    if (lVar19 == 1) {
LAB_00192fc4:
      pbVar17 = (byte *)_Var20._M_p;
      if (((ulong)(byte)*_Var20._M_p < 0x2d) &&
         ((0x130100002200U >> ((ulong)(byte)*_Var20._M_p & 0x3f) & 1) != 0)) {
        pbVar17 = pbVar24;
      }
    }
    else if (lVar19 == 2) {
LAB_00192faa:
      pbVar17 = (byte *)_Var20._M_p;
      if (((ulong)(byte)*_Var20._M_p < 0x2d) &&
         ((0x130100002200U >> ((ulong)(byte)*_Var20._M_p & 0x3f) & 1) != 0)) {
        _Var20._M_p = _Var20._M_p + 1;
        goto LAB_00192fc4;
      }
    }
    else {
      pbVar17 = pbVar24;
      if (((lVar19 == 3) && (pbVar17 = (byte *)_Var20._M_p, (ulong)(byte)*_Var20._M_p < 0x2d)) &&
         ((0x130100002200U >> ((ulong)(byte)*_Var20._M_p & 0x3f) & 1) != 0)) {
        _Var20._M_p = _Var20._M_p + 1;
        goto LAB_00192faa;
      }
    }
LAB_00192fd9:
    lVar19 = (long)pbVar24 - (long)pbVar17 >> 2;
    pbVar16 = pbVar24;
    if (0 < lVar19) {
      pbVar16 = (byte *)(_Var6._M_p +
                        (sVar7 - ((long)pbVar24 - (long)pbVar17 & 0xfffffffffffffffcU)));
      lVar19 = lVar19 + 1;
      do {
        if ((0x2c < (ulong)pbVar24[-1]) ||
           ((0x130100002200U >> ((ulong)pbVar24[-1] & 0x3f) & 1) == 0)) goto LAB_00193296;
        if ((0x2c < (ulong)pbVar24[-2]) ||
           ((0x130100002200U >> ((ulong)pbVar24[-2] & 0x3f) & 1) == 0)) {
          pbVar24 = pbVar24 + -1;
          goto LAB_00193296;
        }
        if ((0x2c < (ulong)pbVar24[-3]) ||
           ((0x130100002200U >> ((ulong)pbVar24[-3] & 0x3f) & 1) == 0)) {
          pbVar24 = pbVar24 + -2;
          goto LAB_00193296;
        }
        if ((0x2c < (ulong)pbVar24[-4]) ||
           ((0x130100002200U >> ((ulong)pbVar24[-4] & 0x3f) & 1) == 0)) {
          pbVar24 = pbVar24 + -3;
          goto LAB_00193296;
        }
        pbVar24 = pbVar24 + -4;
        lVar19 = lVar19 + -1;
      } while (1 < lVar19);
    }
    lVar19 = (long)pbVar16 - (long)pbVar17;
    pbVar24 = pbVar17;
    if (lVar19 == 1) {
LAB_001930b7:
      if ((0x2c < (ulong)pbVar16[-1]) || ((0x130100002200U >> ((ulong)pbVar16[-1] & 0x3f) & 1) == 0)
         ) goto LAB_001930ce;
    }
    else {
      if (lVar19 == 2) {
LAB_001930a4:
        if (((ulong)pbVar16[-1] < 0x2d) &&
           ((0x130100002200U >> ((ulong)pbVar16[-1] & 0x3f) & 1) != 0)) {
          pbVar16 = pbVar16 + -1;
          goto LAB_001930b7;
        }
      }
      else {
        if (lVar19 != 3) goto LAB_00193296;
        if (((ulong)pbVar16[-1] < 0x2d) &&
           ((0x130100002200U >> ((ulong)pbVar16[-1] & 0x3f) & 1) != 0)) {
          pbVar16 = pbVar16 + -1;
          goto LAB_001930a4;
        }
      }
LAB_001930ce:
      pbVar24 = pbVar16;
    }
LAB_00193296:
    if ((long)pbVar24 - (long)pbVar17 == 0) goto LAB_001944c1;
    if (((char *)0xff < local_1f0.line_buffer._M_string_length) &&
       (((local_1f0.program)->opt).pedantic != false)) {
      local_270._16_8_ = local_258 + 1;
      local_270._0_8_ = &local_1f0.stream;
      local_270._8_8_ = local_258;
      ProgramContext::pedantic<TokenStream::TokenInfo>
                (local_1f0.program,(TokenInfo *)local_270,
                 "line is too long, miss2 only allows 255 characters [-pedantic]");
    }
    if (local_1f0.in_dump_mode == true) {
      lex_gettok(&local_248,(char *)pbVar17,(char *)pbVar24);
      if (((vector<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,std::allocator<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>
            )local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ ==
           (vector<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,std::allocator<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>
            )0x1) &&
         ((local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.
           second != 7 ||
          (iVar8 = strncasecmp(local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>
                               .storage_.value_.first,"ENDDUMP",7), iVar8 != 0)))) {
        std::vector<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>::reserve
                  (&local_1f0.tokens,
                   ((long)local_1f0.tokens.
                          super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_1f0.tokens.
                          super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                   ((long)pbVar24 - (long)pbVar17) / 3);
        local_258 = local_258 + -(long)_Var6._M_p;
        lVar19 = local_f8 - (long)_Var6._M_p;
        do {
          lex_gettok(&local_220,(char *)pbVar17,(char *)pbVar24);
          uVar4 = local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.
                  value_.first;
          bVar27 = local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_;
          if (local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ == true) {
            pbVar17 = local_258 +
                      (long)local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                            storage_.value_.first;
            if (*local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.
                 value_.first == 0x22) {
              pbVar17 = (byte *)lex_token(&local_1f0,
                                          local_220.
                                          super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>
                                          .storage_.value_.first,(char *)pbVar24,(size_t)pbVar17);
            }
            else {
              local_250 = (byte *)local_220.
                                  super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                                  storage_.value_.second;
              if ((local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.
                   value_.second & 1) == 0) {
                pbVar23 = (byte *)(local_220.
                                   super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                                   storage_.value_.first +
                                  local_220.
                                  super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                                  storage_.value_.second);
                uVar14 = local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                         storage_.value_.first;
                if (0 < (long)local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                              storage_.value_.second >> 2) {
                  uVar14 = local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                           storage_.value_.first +
                           (local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                            storage_.value_.second & 0xfffffffffffffffc);
                  lVar21 = ((long)local_220.
                                  super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                                  storage_.value_.second >> 2) + 1;
                  pbVar16 = (byte *)(local_220.
                                     super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                                     storage_.value_.first + 3);
                  do {
                    if ((9 < (int)(char)pbVar16[-3] - 0x30U) &&
                       ((uVar22 = pbVar16[-3] - 0x41, 0x25 < uVar22 ||
                        ((0x3f0000003fU >> ((ulong)uVar22 & 0x3f) & 1) == 0)))) {
                      pbVar16 = pbVar16 + -3;
                      goto LAB_001935a1;
                    }
                    if ((9 < (int)(char)pbVar16[-2] - 0x30U) &&
                       ((uVar22 = pbVar16[-2] - 0x41, 0x25 < uVar22 ||
                        ((0x3f0000003fU >> ((ulong)uVar22 & 0x3f) & 1) == 0)))) {
                      pbVar16 = pbVar16 + -2;
                      goto LAB_001935a1;
                    }
                    if ((9 < (int)(char)pbVar16[-1] - 0x30U) &&
                       ((uVar22 = pbVar16[-1] - 0x41, 0x25 < uVar22 ||
                        ((0x3f0000003fU >> ((ulong)uVar22 & 0x3f) & 1) == 0)))) {
                      pbVar16 = pbVar16 + -1;
                      goto LAB_001935a1;
                    }
                    if ((9 < (int)(char)*pbVar16 - 0x30U) &&
                       ((uVar22 = *pbVar16 - 0x41, 0x25 < uVar22 ||
                        ((0x3f0000003fU >> ((ulong)uVar22 & 0x3f) & 1) == 0)))) goto LAB_001935a1;
                    lVar21 = lVar21 + -1;
                    pbVar16 = pbVar16 + 4;
                  } while (1 < lVar21);
                }
                lVar21 = (long)pbVar23 - uVar14;
                if (lVar21 == 1) {
LAB_00193571:
                  pbVar16 = pbVar23;
                  if (((9 < (int)(char)*(byte *)uVar14 - 0x30U) &&
                      (uVar22 = *(byte *)uVar14 - 0x41, pbVar16 = (byte *)uVar14, uVar22 < 0x26)) &&
                     ((0x3f0000003fU >> ((ulong)uVar22 & 0x3f) & 1) != 0)) {
                    pbVar16 = pbVar23;
                  }
                }
                else if (lVar21 == 2) {
LAB_00193545:
                  if (((int)(char)*(byte *)uVar14 - 0x30U < 10) ||
                     ((uVar22 = *(byte *)uVar14 - 0x41, pbVar16 = (byte *)uVar14, uVar22 < 0x26 &&
                      ((0x3f0000003fU >> ((ulong)uVar22 & 0x3f) & 1) != 0)))) {
                    uVar14 = uVar14 + 1;
                    goto LAB_00193571;
                  }
                }
                else {
                  pbVar16 = pbVar23;
                  if ((lVar21 == 3) &&
                     (((int)(char)*(byte *)uVar14 - 0x30U < 10 ||
                      ((uVar22 = *(byte *)uVar14 - 0x41, pbVar16 = (byte *)uVar14, uVar22 < 0x26 &&
                       ((0x3f0000003fU >> ((ulong)uVar22 & 0x3f) & 1) != 0)))))) {
                    uVar14 = uVar14 + 1;
                    goto LAB_00193545;
                  }
                }
LAB_001935a1:
                if (pbVar16 == pbVar23) {
                  if ((byte *)local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                              storage_.value_.second != (byte *)0x0) {
                    pbVar17 = (byte *)((long)pbVar17 * 2 + 2);
                    pbVar23 = (byte *)(local_220.
                                       super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                                       storage_.value_.first + (long)((byte *)_Var26._M_p + lVar19))
                    ;
                    pbVar16 = (byte *)0x0;
                    do {
                      if ((((int)(char)*(byte *)(uVar4 + (long)pbVar16) - 0x30U < 10) ||
                          ((uVar22 = *(byte *)(uVar4 + (long)pbVar16) - 0x41, uVar22 < 0x26 &&
                           ((0x3f0000003fU >> ((ulong)uVar22 & 0x3f) & 1) != 0)))) &&
                         (((int)(char)((byte *)(uVar4 + 1))[(long)pbVar16] - 0x30U < 10 ||
                          ((uVar22 = ((byte *)(uVar4 + 1))[(long)pbVar16] - 0x41, uVar22 < 0x26 &&
                           ((0x3f0000003fU >> ((ulong)uVar22 & 0x3f) & 1) != 0)))))) {
                        LexerContext::add_token
                                  (&local_1f0,Hexadecimal,(size_t)(pbVar23 + (long)pbVar16),2);
                      }
                      else {
                        local_270._8_8_ = pbVar23 + (long)pbVar16;
                        local_1f0.any_error = true;
                        local_270._0_8_ = &local_1f0.stream;
                        local_270._16_8_ = pbVar17;
                        ProgramContext::error<TokenStream::TokenInfo>
                                  (local_1f0.program,(TokenInfo *)local_270,
                                   "invalid hexadecimal token");
                      }
                      pbVar16 = pbVar16 + 2;
                      pbVar17 = pbVar17 + 4;
                    } while (pbVar16 < local_250);
                  }
                }
                else {
                  local_1f0.any_error = true;
                  local_270._16_8_ =
                       local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                       storage_.value_.second + (long)pbVar17 * 2;
                  local_270._0_8_ = &local_1f0.stream;
                  local_270._8_8_ = pbVar17;
                  ProgramContext::error<TokenStream::TokenInfo>
                            (local_1f0.program,(TokenInfo *)local_270,"invalid hexadecimal token");
                }
              }
              else {
                local_1f0.any_error = true;
                local_270._16_8_ =
                     local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.
                     value_.second + (long)pbVar17 * 2;
                local_270._0_8_ = &local_1f0.stream;
                local_270._8_8_ = pbVar17;
                ProgramContext::error<TokenStream::TokenInfo>
                          (local_1f0.program,(TokenInfo *)local_270,
                           "hexadecimal tokens must have pairs of two digits");
              }
              pbVar16 = (byte *)(uVar4 + (long)local_250);
              lVar21 = (long)pbVar24 - (long)pbVar16 >> 2;
              pbVar23 = local_128;
              if (0 < lVar21) {
                pbVar16 = pbVar16 + ((long)pbVar24 - (long)pbVar16 & 0xfffffffffffffffc);
                lVar21 = lVar21 + 1;
                pbVar17 = (byte *)(uVar4 + (long)local_250) + 1;
                do {
                  if ((0x2c < (ulong)pbVar17[-1]) ||
                     ((0x130100002200U >> ((ulong)pbVar17[-1] & 0x3f) & 1) == 0)) {
                    pbVar17 = pbVar17 + -1;
                    goto LAB_0019375d;
                  }
                  if ((0x2c < (ulong)*pbVar17) ||
                     ((0x130100002200U >> ((ulong)*pbVar17 & 0x3f) & 1) == 0)) goto LAB_0019375d;
                  if ((0x2c < (ulong)pbVar17[1]) ||
                     ((0x130100002200U >> ((ulong)pbVar17[1] & 0x3f) & 1) == 0)) {
                    pbVar17 = pbVar17 + 1;
                    goto LAB_0019375d;
                  }
                  if ((0x2c < (ulong)pbVar17[2]) ||
                     ((0x130100002200U >> ((ulong)pbVar17[2] & 0x3f) & 1) == 0)) {
                    pbVar17 = pbVar17 + 2;
                    goto LAB_0019375d;
                  }
                  lVar21 = lVar21 + -1;
                  pbVar17 = pbVar17 + 4;
                } while (1 < lVar21);
              }
              lVar21 = (long)pbVar24 - (long)pbVar16;
              if (lVar21 != 1) {
                if (lVar21 != 2) {
                  pbVar17 = pbVar24;
                  if (((lVar21 != 3) || (pbVar17 = pbVar16, 0x2c < (ulong)*pbVar16)) ||
                     ((0x130100002200U >> ((ulong)*pbVar16 & 0x3f) & 1) == 0)) goto LAB_0019375d;
                  pbVar16 = pbVar16 + 1;
                }
                pbVar17 = pbVar16;
                if ((0x2c < (ulong)*pbVar16) ||
                   ((0x130100002200U >> ((ulong)*pbVar16 & 0x3f) & 1) == 0)) goto LAB_0019375d;
                pbVar16 = pbVar16 + 1;
              }
              pbVar17 = pbVar16;
              if (((ulong)*pbVar16 < 0x2d) &&
                 ((0x130100002200U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0)) {
                pbVar17 = pbVar24;
              }
            }
          }
LAB_0019375d:
        } while (bVar27 != false);
        LexerContext::add_token(&local_1f0,NewLine,local_228,0);
        goto LAB_001944c1;
      }
    }
    lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)local_270,(char *)pbVar17,
               (char *)pbVar24);
    uVar14 = local_270._16_8_;
    uVar4 = local_270._8_8_;
    if ((local_270[0] == (allocator<char>)0x1) &&
       (*(byte *)(local_270._8_8_ + (long)(local_270._16_8_ - 1)) == 0x3a)) {
      LexerContext::add_token
                (&local_1f0,Label,(size_t)(local_270._8_8_ + ((long)local_258 - (long)_Var6._M_p)),
                 local_270._16_8_);
      pbVar16 = (byte *)(uVar4 + uVar14);
      lVar19 = (long)pbVar24 - (long)pbVar16 >> 2;
      if (0 < lVar19) {
        pbVar16 = pbVar16 + ((long)pbVar24 - (long)pbVar16 & 0xfffffffffffffffc);
        lVar19 = lVar19 + 1;
        pbVar17 = (byte *)(uVar4 + (long)(uVar14 + 1));
        do {
          if ((0x2c < (ulong)pbVar17[-1]) ||
             ((0x130100002200U >> ((ulong)pbVar17[-1] & 0x3f) & 1) == 0)) {
            pbVar17 = pbVar17 + -1;
            goto LAB_00193a94;
          }
          if ((0x2c < (ulong)*pbVar17) || ((0x130100002200U >> ((ulong)*pbVar17 & 0x3f) & 1) == 0))
          goto LAB_00193a94;
          if ((0x2c < (ulong)pbVar17[1]) ||
             ((0x130100002200U >> ((ulong)pbVar17[1] & 0x3f) & 1) == 0)) {
            pbVar17 = pbVar17 + 1;
            goto LAB_00193a94;
          }
          if ((0x2c < (ulong)pbVar17[2]) ||
             ((0x130100002200U >> ((ulong)pbVar17[2] & 0x3f) & 1) == 0)) {
            pbVar17 = pbVar17 + 2;
            goto LAB_00193a94;
          }
          lVar19 = lVar19 + -1;
          pbVar17 = pbVar17 + 4;
        } while (1 < lVar19);
      }
      lVar19 = (long)pbVar24 - (long)pbVar16;
      if (lVar19 != 1) {
        if (lVar19 != 2) {
          pbVar17 = pbVar24;
          if (((lVar19 != 3) || (pbVar17 = pbVar16, 0x2c < (ulong)*pbVar16)) ||
             ((0x130100002200U >> ((ulong)*pbVar16 & 0x3f) & 1) == 0)) goto LAB_00193a94;
          pbVar16 = pbVar16 + 1;
        }
        pbVar17 = pbVar16;
        if ((0x2c < (ulong)*pbVar16) || ((0x130100002200U >> ((ulong)*pbVar16 & 0x3f) & 1) == 0))
        goto LAB_00193a94;
        pbVar16 = pbVar16 + 1;
      }
      pbVar17 = pbVar16;
      if (((ulong)*pbVar16 < 0x2d) && ((0x130100002200U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0)) {
        pbVar17 = pbVar24;
      }
    }
LAB_00193a94:
    lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)local_270,(char *)pbVar17,
               (char *)pbVar24);
    if (local_270[0] == (allocator<char>)0x1) {
      if ((byte *)local_270._16_8_ == (byte *)0x7) {
        iVar8 = strncasecmp((char *)local_270._8_8_,"ENDDUMP",7);
        if (iVar8 == 0) {
          local_1f0.in_dump_mode = false;
        }
      }
      else if (((byte *)local_270._16_8_ == (byte *)0x4) &&
              (iVar8 = strncasecmp((char *)local_270._8_8_,"DUMP",4), iVar8 == 0)) {
        local_1f0.in_dump_mode = true;
      }
    }
    lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)local_270,(char *)pbVar17,
               (char *)pbVar24);
    uVar4 = local_270._8_8_;
    if (local_270[0] == (allocator<char>)0x1) {
      if ((byte *)local_270._16_8_ == (byte *)0x5) {
        iVar8 = strncasecmp((char *)local_270._8_8_,"WHILE",5);
        if (iVar8 != 0) goto LAB_00193b8e;
        LexerContext::add_token
                  (&local_1f0,WHILE,(size_t)(uVar4 + ((long)local_258 - (long)_Var6._M_p)),5);
        pbVar16 = (byte *)(uVar4 + 5);
        lVar19 = (long)pbVar24 - (long)pbVar16 >> 2;
        if (0 < lVar19) {
          pbVar16 = pbVar16 + ((long)pbVar24 - (long)pbVar16 & 0xfffffffffffffffc);
          lVar19 = lVar19 + 1;
          pbVar17 = (byte *)(uVar4 + 6);
          do {
            if ((0x2c < (ulong)pbVar17[-1]) ||
               ((0x130100002200U >> ((ulong)pbVar17[-1] & 0x3f) & 1) == 0)) goto LAB_0019416c;
            if ((0x2c < (ulong)*pbVar17) || ((0x130100002200U >> ((ulong)*pbVar17 & 0x3f) & 1) == 0)
               ) goto LAB_00194184;
            if ((0x2c < (ulong)pbVar17[1]) ||
               ((0x130100002200U >> ((ulong)pbVar17[1] & 0x3f) & 1) == 0)) goto LAB_00194176;
            if ((0x2c < (ulong)pbVar17[2]) ||
               ((0x130100002200U >> ((ulong)pbVar17[2] & 0x3f) & 1) == 0)) goto LAB_00194180;
            lVar19 = lVar19 + -1;
            pbVar17 = pbVar17 + 4;
          } while (1 < lVar19);
        }
      }
      else {
        if (((byte *)local_270._16_8_ != (byte *)0x2) ||
           (iVar8 = strncasecmp((char *)local_270._8_8_,"IF",2), iVar8 != 0)) goto LAB_00193b8e;
        LexerContext::add_token
                  (&local_1f0,IF,(size_t)(uVar4 + ((long)local_258 - (long)_Var6._M_p)),2);
        pbVar16 = (byte *)(uVar4 + 2);
        lVar19 = (long)pbVar24 - (long)pbVar16 >> 2;
        if (0 < lVar19) {
          pbVar16 = pbVar16 + ((long)pbVar24 - (long)pbVar16 & 0xfffffffffffffffc);
          lVar19 = lVar19 + 1;
          pbVar17 = (byte *)(uVar4 + 3);
          do {
            if ((0x2c < (ulong)pbVar17[-1]) ||
               ((0x130100002200U >> ((ulong)pbVar17[-1] & 0x3f) & 1) == 0)) goto LAB_0019416c;
            if ((0x2c < (ulong)*pbVar17) || ((0x130100002200U >> ((ulong)*pbVar17 & 0x3f) & 1) == 0)
               ) goto LAB_00194184;
            if ((0x2c < (ulong)pbVar17[1]) ||
               ((0x130100002200U >> ((ulong)pbVar17[1] & 0x3f) & 1) == 0)) goto LAB_00194176;
            if ((0x2c < (ulong)pbVar17[2]) ||
               ((0x130100002200U >> ((ulong)pbVar17[2] & 0x3f) & 1) == 0)) goto LAB_00194180;
            lVar19 = lVar19 + -1;
            pbVar17 = pbVar17 + 4;
          } while (1 < lVar19);
        }
      }
      lVar19 = (long)pbVar24 - (long)pbVar16;
      bVar27 = true;
      if (lVar19 == 1) {
LAB_00193ffb:
        if (((ulong)*pbVar16 < 0x2d) &&
           (pbVar17 = pbVar24, (0x130100002200U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0))
        goto LAB_00193b96;
      }
      else if (lVar19 == 2) {
LAB_00193fe1:
        if (((ulong)*pbVar16 < 0x2d) && ((0x130100002200U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0)) {
          pbVar16 = pbVar16 + 1;
          goto LAB_00193ffb;
        }
      }
      else {
        pbVar17 = pbVar24;
        if (lVar19 != 3) goto LAB_00193b96;
        if (((ulong)*pbVar16 < 0x2d) && ((0x130100002200U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0)) {
          pbVar16 = pbVar16 + 1;
          goto LAB_00193fe1;
        }
      }
      pbVar17 = pbVar16;
    }
    else {
LAB_00193b8e:
      bVar27 = false;
    }
    goto LAB_00193b96;
  }
  pbVar24 = local_258 + ((long)pbVar16 - (long)local_1f0.line_buffer._M_dataplus._M_p);
  if (((local_1f0.program)->opt).pedantic == true) {
    local_270._16_8_ = pbVar24 + 1;
    local_270._0_8_ = &local_1f0.stream;
    local_270._8_8_ = pbVar24;
    ProgramContext::pedantic<TokenStream::TokenInfo>
              (local_1f0.program,(TokenInfo *)local_270,
               "preprocessor is a language extension [-pedantic]");
  }
  lex_gettok(&local_220,(char *)(pbVar16 + 1),(char *)pbVar17);
  uVar14 = local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.
           second;
  uVar4 = local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.
          first;
  if (local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ == true) {
    local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>._0_8_ =
         (basic_string_view<char,_std::char_traits<char>_> *)0x0;
    local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.first =
         (char *)0x0;
    local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.second = 0
    ;
    local_200 = (byte *)local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                        storage_.value_.first;
    pbStack_1f8 = (byte *)local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                          storage_.value_.second;
    local_208 = '\x01';
    while( true ) {
      if (local_208 == '\0') {
        __assert_fail("initialized()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/optional/include/optional/optional.hpp"
                      ,0x1fb,
                      "T *std::experimental::optional<std::pair<const char *, unsigned long>>::operator->() [T = std::pair<const char *, unsigned long>]"
                     );
      }
      lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)local_270,
                 (char *)(local_200 + (long)pbStack_1f8),(char *)pbVar17);
      if (local_208 == '\x01') {
        if (local_270[0] == (allocator<char>)0x0) {
          local_208 = '\0';
        }
        else {
          local_200 = (byte *)local_270._8_8_;
          pbStack_1f8 = (byte *)local_270._16_8_;
        }
      }
      else if (local_270[0] != (allocator<char>)0x0) {
        local_200 = (byte *)local_270._8_8_;
        pbStack_1f8 = (byte *)local_270._16_8_;
        local_208 = '\x01';
      }
      if (local_208 != '\x01') break;
      std::
      vector<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,std::allocator<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<char_const*&,unsigned_long&>
                ((vector<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,std::allocator<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>
                  *)&local_248,(char **)&local_200,(unsigned_long *)&pbStack_1f8);
    }
    if ((byte *)uVar14 == (byte *)0x4) {
      iVar8 = bcmp((void *)uVar4,"else",4);
      if (iVar8 != 0) goto LAB_00193178;
      if (local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.
          first != (char *)local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                           _0_8_) {
        local_1f0.any_error = true;
        local_270._16_8_ = pbVar24 + 1;
        local_270._0_8_ = &local_1f0.stream;
        local_270._8_8_ = pbVar24;
        ProgramContext::error<TokenStream::TokenInfo>
                  (local_1f0.program,(TokenInfo *)local_270,
                   "too many tokens in preprocessor directive");
      }
      if ((ulong)((long)local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start) < 2) {
        local_1f0.any_error = true;
        local_270._0_8_ = &local_1f0.stream;
        local_270._16_8_ = pbVar24 + 1;
        local_270._8_8_ = pbVar24;
        ProgramContext::error<TokenStream::TokenInfo>
                  (local_1f0.program,(TokenInfo *)local_270,"#else without #ifdef");
      }
      else if (local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start
               [((long)local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start) - 2] != '\0') {
        local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish[-1] =
             local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish[-1] == '\0';
      }
    }
    else {
      if ((byte *)uVar14 == (byte *)0x6) {
        iVar8 = bcmp((void *)uVar4,"ifndef",6);
        if (iVar8 == 0) {
LAB_001931db:
          if ((long)local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.
                    value_.first -
              local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>._0_8_ != 0x10) {
            local_1f0.any_error = true;
            local_270._0_8_ = &local_1f0.stream;
            local_270._16_8_ = pbVar24 + 1;
            local_270._8_8_ = pbVar24;
            ProgramContext::error<TokenStream::TokenInfo>
                      (local_1f0.program,(TokenInfo *)local_270,
                       "wrong number of tokens in preprocessor directive");
          }
          pPVar5 = local_1f0.program;
          if (local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.
              first == (char *)local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>
                               ._0_8_) goto LAB_001931b3;
          cVar3 = local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
          cVar9 = std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::
                  _M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                              *)&((local_1f0.program)->opt).defines,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                             _0_8_);
          p_Var25 = &(pPVar5->opt).defines._M_t._M_impl.super__Rb_tree_header;
          if (*(byte *)(uVar4 + 2) == 0x6e) {
            if ((_Rb_tree_header *)cVar9._M_node != p_Var25) goto LAB_00193266;
LAB_001940de:
            bVar27 = cVar3 != '\0';
          }
          else {
            if ((_Rb_tree_header *)cVar9._M_node != p_Var25) goto LAB_001940de;
LAB_00193266:
            bVar27 = false;
          }
          local_270[0] = (allocator<char>)bVar27;
          std::vector<char,_std::allocator<char>_>::emplace_back<bool>
                    (&local_1f0.cpp_stack,(bool *)local_270);
          goto LAB_001931b3;
        }
      }
      else if ((byte *)uVar14 == (byte *)0x5) {
        iVar8 = bcmp((void *)uVar4,"ifdef",5);
        if (iVar8 == 0) goto LAB_001931db;
        iVar8 = bcmp((void *)uVar4,"endif",5);
        if (iVar8 == 0) {
          if (local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.
              first != (char *)local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>
                               ._0_8_) {
            local_1f0.any_error = true;
            local_270._16_8_ = pbVar24 + 1;
            local_270._0_8_ = &local_1f0.stream;
            local_270._8_8_ = pbVar24;
            ProgramContext::error<TokenStream::TokenInfo>
                      (local_1f0.program,(TokenInfo *)local_270,
                       "too many tokens in preprocessor directive");
          }
          if ((ulong)((long)local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>.
                           _M_impl.super__Vector_impl_data._M_start) < 2) {
            local_1f0.any_error = true;
            local_270._0_8_ = &local_1f0.stream;
            local_270._16_8_ = pbVar24 + 1;
            local_270._8_8_ = pbVar24;
            ProgramContext::error<TokenStream::TokenInfo>
                      (local_1f0.program,(TokenInfo *)local_270,"#endif without #ifdef");
          }
          else {
            local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1f0.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
          }
          goto LAB_001931b3;
        }
      }
LAB_00193178:
      local_1f0.any_error = true;
      local_270._0_8_ = &local_1f0.stream;
      local_270._16_8_ = pbVar24 + 1;
      local_270._8_8_ = pbVar24;
      ProgramContext::error<TokenStream::TokenInfo>
                (local_1f0.program,(TokenInfo *)local_270,"unknown preprocessor directive");
    }
LAB_001931b3:
    if ((basic_string_view<char,_std::char_traits<char>_> *)
        local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>._0_8_ !=
        (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
      operator_delete((void *)local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                              _0_8_,
                      local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_
                      .value_.second -
                      local_248.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>._0_8_);
    }
  }
  goto LAB_001944c1;
LAB_0019416c:
  pbVar17 = pbVar17 + -1;
  goto LAB_00194184;
LAB_00194176:
  pbVar17 = pbVar17 + 1;
  goto LAB_00194184;
LAB_00194180:
  pbVar17 = pbVar17 + 2;
LAB_00194184:
  bVar27 = true;
LAB_00193b96:
  lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)local_270,(char *)pbVar17,(char *)pbVar24
            );
  pbVar16 = (byte *)local_270._8_8_;
  if (local_270[0] == (allocator<char>)0x1) {
    if ((byte *)local_270._16_8_ == (byte *)0x2) {
      iVar8 = strncasecmp((char *)local_270._8_8_,"OR",2);
      if (iVar8 == 0) {
        LexerContext::add_token
                  (&local_1f0,OR,(size_t)(pbVar16 + ((long)local_258 - (long)_Var6._M_p)),2);
        pbVar10 = pbVar16 + 2;
        lVar19 = (long)pbVar24 - (long)pbVar10 >> 2;
        if (0 < lVar19) {
          pbVar10 = pbVar10 + ((long)pbVar24 - (long)pbVar10 & 0xfffffffffffffffc);
          lVar19 = lVar19 + 1;
          pbVar17 = pbVar16 + 3;
          do {
            if ((0x2c < (ulong)pbVar17[-1]) ||
               ((0x130100002200U >> ((ulong)pbVar17[-1] & 0x3f) & 1) == 0)) goto LAB_00194171;
            if ((0x2c < (ulong)*pbVar17) || ((0x130100002200U >> ((ulong)*pbVar17 & 0x3f) & 1) == 0)
               ) goto LAB_00194193;
            if ((0x2c < (ulong)pbVar17[1]) ||
               ((0x130100002200U >> ((ulong)pbVar17[1] & 0x3f) & 1) == 0)) goto LAB_0019417b;
            if ((0x2c < (ulong)pbVar17[2]) ||
               ((0x130100002200U >> ((ulong)pbVar17[2] & 0x3f) & 1) == 0)) goto LAB_0019418f;
            lVar19 = lVar19 + -1;
            pbVar17 = pbVar17 + 4;
          } while (1 < lVar19);
        }
        goto LAB_00194024;
      }
    }
    else if (((byte *)local_270._16_8_ == (byte *)0x3) &&
            (iVar8 = strncasecmp((char *)local_270._8_8_,"AND",3), iVar8 == 0)) {
      LexerContext::add_token
                (&local_1f0,AND,(size_t)(pbVar16 + ((long)local_258 - (long)_Var6._M_p)),3);
      pbVar10 = pbVar16 + 3;
      lVar19 = (long)pbVar24 - (long)pbVar10 >> 2;
      if (0 < lVar19) {
        pbVar10 = pbVar10 + ((long)pbVar24 - (long)pbVar10 & 0xfffffffffffffffc);
        lVar19 = lVar19 + 1;
        do {
          pbVar17 = pbVar16 + 4;
          if ((0x2c < (ulong)pbVar16[3]) ||
             ((0x130100002200U >> ((ulong)pbVar16[3] & 0x3f) & 1) == 0)) goto LAB_00194171;
          if ((0x2c < (ulong)*pbVar17) || ((0x130100002200U >> ((ulong)*pbVar17 & 0x3f) & 1) == 0))
          goto LAB_00194193;
          if ((0x2c < (ulong)pbVar16[5]) ||
             ((0x130100002200U >> ((ulong)pbVar16[5] & 0x3f) & 1) == 0)) goto LAB_0019417b;
          if ((0x2c < (ulong)pbVar16[6]) ||
             ((0x130100002200U >> ((ulong)pbVar16[6] & 0x3f) & 1) == 0)) goto LAB_0019418f;
          lVar19 = lVar19 + -1;
          pbVar16 = pbVar17;
        } while (1 < lVar19);
      }
LAB_00194024:
      lVar19 = (long)pbVar24 - (long)pbVar10;
      bVar27 = true;
      if (lVar19 == 1) {
LAB_00194076:
        if (((ulong)*pbVar10 < 0x2d) &&
           (pbVar17 = pbVar24, (0x130100002200U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0))
        goto LAB_00194199;
      }
      else if (lVar19 == 2) {
LAB_0019405c:
        if (((ulong)*pbVar10 < 0x2d) && ((0x130100002200U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0)) {
          pbVar10 = pbVar10 + 1;
          goto LAB_00194076;
        }
      }
      else {
        pbVar17 = pbVar24;
        if (lVar19 != 3) goto LAB_00194199;
        if (((ulong)*pbVar10 < 0x2d) && ((0x130100002200U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0)) {
          pbVar10 = pbVar10 + 1;
          goto LAB_0019405c;
        }
      }
      pbVar17 = pbVar10;
    }
  }
  goto LAB_00194199;
LAB_00194171:
  pbVar17 = pbVar17 + -1;
  goto LAB_00194193;
LAB_0019417b:
  pbVar17 = pbVar17 + 1;
  goto LAB_00194193;
LAB_0019418f:
  pbVar17 = pbVar17 + 2;
LAB_00194193:
  bVar27 = true;
LAB_00194199:
  lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)local_270,(char *)pbVar17,(char *)pbVar24
            );
  pbVar16 = (byte *)local_270._8_8_;
  if (((local_270[0] == (allocator<char>)0x1) && ((byte *)local_270._16_8_ == (byte *)0x3)) &&
     (iVar8 = strncasecmp((char *)local_270._8_8_,"NOT",3), iVar8 == 0)) {
    LexerContext::add_token
              (&local_1f0,NOT,(size_t)(pbVar16 + ((long)local_258 - (long)_Var6._M_p)),3);
    pbVar10 = pbVar16 + 3;
    lVar19 = (long)pbVar24 - (long)pbVar10 >> 2;
    if (0 < lVar19) {
      pbVar10 = pbVar10 + ((long)pbVar24 - (long)pbVar10 & 0xfffffffffffffffc);
      lVar19 = lVar19 + 1;
      do {
        pbVar17 = pbVar16 + 4;
        if ((0x2c < (ulong)pbVar16[3]) || ((0x130100002200U >> ((ulong)pbVar16[3] & 0x3f) & 1) == 0)
           ) {
          pbVar17 = pbVar16 + 3;
LAB_001947d9:
          bVar27 = true;
          goto LAB_001942b3;
        }
        if ((0x2c < (ulong)*pbVar17) || ((0x130100002200U >> ((ulong)*pbVar17 & 0x3f) & 1) == 0))
        goto LAB_001947d9;
        if ((0x2c < (ulong)pbVar16[5]) || ((0x130100002200U >> ((ulong)pbVar16[5] & 0x3f) & 1) == 0)
           ) {
          pbVar17 = pbVar16 + 5;
          goto LAB_001947d9;
        }
        if ((0x2c < (ulong)pbVar16[6]) || ((0x130100002200U >> ((ulong)pbVar16[6] & 0x3f) & 1) == 0)
           ) {
          pbVar17 = pbVar16 + 6;
          goto LAB_001947d9;
        }
        lVar19 = lVar19 + -1;
        pbVar16 = pbVar17;
      } while (1 < lVar19);
    }
    lVar19 = (long)pbVar24 - (long)pbVar10;
    bVar27 = true;
    if (lVar19 == 1) {
LAB_001945c7:
      if (((ulong)*pbVar10 < 0x2d) &&
         (pbVar17 = pbVar24, (0x130100002200U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0))
      goto LAB_001942b3;
    }
    else if (lVar19 == 2) {
LAB_001945b5:
      if (((ulong)*pbVar10 < 0x2d) && ((0x130100002200U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0)) {
        pbVar10 = pbVar10 + 1;
        goto LAB_001945c7;
      }
    }
    else {
      pbVar17 = pbVar24;
      if (lVar19 != 3) goto LAB_001942b3;
      if (((ulong)*pbVar10 < 0x2d) && ((0x130100002200U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0)) {
        pbVar10 = pbVar10 + 1;
        goto LAB_001945b5;
      }
    }
    pbVar17 = pbVar10;
  }
LAB_001942b3:
  if (pbVar17 != pbVar24) {
    uVar11 = (ulong)*pbVar17;
    pbVar10 = pbVar17;
    pbVar16 = pbVar17;
    if ((uVar11 < 0x3f) &&
       (((0x70008c0000000000U >> (uVar11 & 0x3f) & 1) != 0 ||
        ((uVar11 == 0x2d &&
         ((pbVar17 + 1 == pbVar24 || (bVar2 = pbVar17[1], bVar2 != 0x2e && 9 < (byte)(bVar2 - 0x30))
          ))))))) {
      lex_expr(&local_1f0,(char *)pbVar17,(char *)pbVar24,
               (size_t)(pbVar17 + ((long)local_258 - (long)_Var6._M_p)));
      bVar18 = false;
      LexerContext::add_token(&local_1f0,NewLine,local_228,0);
    }
    else {
      do {
        pbVar13 = pbVar16 + 1;
        uVar11 = (ulong)*pbVar16;
        if (uVar11 < 0x3f) {
          pbVar12 = pbVar10;
          if (uVar11 == 0x2d) {
            if ((pbVar13 == pbVar24) ||
               (pbVar12 = pbVar16, *pbVar13 != 0x2e && 9 < (byte)(*pbVar13 - 0x30))) break;
          }
          else if ((0x70009f0100002200U >> (uVar11 & 0x3f) & 1) != 0) break;
        }
        pbVar12 = pbVar24;
        pbVar10 = pbVar10 + 1;
        pbVar16 = pbVar13;
      } while (pbVar13 != pbVar24);
      lVar19 = (long)pbVar24 - (long)pbVar12 >> 2;
      pbVar16 = pbVar12;
      if (0 < lVar19) {
        pbVar16 = pbVar12 + ((long)pbVar24 - (long)pbVar12 & 0xfffffffffffffffc);
        lVar19 = lVar19 + 1;
        pbVar12 = pbVar12 + 3;
        do {
          if ((0x2c < (ulong)pbVar12[-3]) ||
             ((0x130100002200U >> ((ulong)pbVar12[-3] & 0x3f) & 1) == 0)) {
            pbVar12 = pbVar12 + -3;
            goto LAB_00194712;
          }
          if ((0x2c < (ulong)pbVar12[-2]) ||
             ((0x130100002200U >> ((ulong)pbVar12[-2] & 0x3f) & 1) == 0)) {
            pbVar12 = pbVar12 + -2;
            goto LAB_00194712;
          }
          if ((0x2c < (ulong)pbVar12[-1]) ||
             ((0x130100002200U >> ((ulong)pbVar12[-1] & 0x3f) & 1) == 0)) {
            pbVar12 = pbVar12 + -1;
            goto LAB_00194712;
          }
          if ((0x2c < (ulong)*pbVar12) || ((0x130100002200U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))
          goto LAB_00194712;
          lVar19 = lVar19 + -1;
          pbVar12 = pbVar12 + 4;
        } while (1 < lVar19);
      }
      lVar19 = (long)pbVar24 - (long)pbVar16;
      if (lVar19 == 1) {
LAB_001946f3:
        pbVar12 = pbVar16;
        if (((ulong)*pbVar16 < 0x2d) && ((0x130100002200U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0)) {
          pbVar12 = pbVar24;
        }
      }
      else if (lVar19 == 2) {
LAB_001946d9:
        pbVar12 = pbVar16;
        if (((ulong)*pbVar16 < 0x2d) && ((0x130100002200U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0)) {
          pbVar16 = pbVar16 + 1;
          goto LAB_001946f3;
        }
      }
      else {
        pbVar12 = pbVar24;
        if (((lVar19 == 3) && (pbVar12 = pbVar16, (ulong)*pbVar16 < 0x2d)) &&
           ((0x130100002200U >> ((ulong)*pbVar16 & 0x3f) & 1) != 0)) {
          pbVar16 = pbVar16 + 1;
          goto LAB_001946d9;
        }
      }
LAB_00194712:
      bVar18 = true;
      if (((pbVar12 != pbVar24) && (uVar11 = (ulong)*pbVar12, uVar11 < 0x3f)) &&
         (((0x70008c0000000000U >> (uVar11 & 0x3f) & 1) != 0 ||
          ((uVar11 == 0x2d &&
           ((pbVar12 + 1 == pbVar24 ||
            (bVar2 = pbVar12[1], 9 < (byte)(bVar2 - 0x30) && bVar2 != 0x2e)))))))) {
        lex_expr(&local_1f0,(char *)pbVar17,(char *)pbVar24,
                 (size_t)(pbVar17 + ((long)local_258 - (long)_Var6._M_p)));
        bVar18 = false;
        LexerContext::add_token(&local_1f0,NewLine,local_228,0);
        pbVar17 = pbVar12;
      }
    }
    if (!bVar18) goto LAB_001944c1;
  }
  if (pbVar17 == pbVar24) {
    if (!bVar27) goto LAB_001944c1;
  }
  else {
    lex_gettok(&local_220,(char *)pbVar17,(char *)pbVar24);
    uVar4 = local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.
            first;
    if (local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ == true) {
      local_f0 = local_258 + ((long)pbVar17 - (long)_Var6._M_p);
      local_250 = local_f0 +
                  ((long)local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                         storage_.value_.first - (long)pbVar17);
      local_258 = (byte *)local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                          storage_.value_.second;
      local_e0 = local_250 +
                 local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.
                 value_.second;
      lVar19 = 0x10;
      bVar18 = false;
      do {
        pbVar23 = *(byte **)((long)&expr_symbols[0x13].second + lVar19);
        if (local_258 == pbVar23) {
          iVar8 = strncasecmp((char *)uVar4,
                              *(char **)((long)&expr_symbols[0x13].first.__size + lVar19),
                              (size_t)pbVar23);
          bVar28 = iVar8 == 0;
        }
        else {
          bVar28 = false;
        }
        if (bVar28) {
          if (bVar27) {
            local_1f0.any_error = true;
            local_270._0_8_ = &local_1f0.stream;
            local_270._8_8_ = local_250;
            local_270._16_8_ = local_e0;
            ProgramContext::error<TokenStream::TokenInfo>
                      (local_1f0.program,(TokenInfo *)local_270,"unexpected token");
          }
          bVar18 = true;
          LexerContext::add_token
                    (&local_1f0,*(Token *)((long)&keycommands[0].first.__data + lVar19),
                     (size_t)local_250,(size_t)local_258);
        }
        pbVar16 = local_f0;
        pbVar23 = local_128;
        bVar29 = lVar19 == 0x2b0;
        lVar19 = lVar19 + 0x18;
      } while (!(bool)(bVar28 | bVar29));
      if (!bVar18) {
        LexerContext::add_token
                  (&local_1f0,Command,(size_t)(uVar4 + ((long)local_f0 - (long)pbVar17)),
                   (size_t)local_258);
      }
      pbVar10 = (byte *)(uVar4 + (long)local_258);
      if (pbVar10 != pbVar24) {
        do {
          pbVar10 = (byte *)lex_token(&local_1f0,(char *)pbVar10,(char *)pbVar24,
                                      (size_t)(pbVar10 + ((long)pbVar16 - (long)pbVar17)));
        } while (pbVar10 != pbVar24);
      }
    }
  }
  LexerContext::add_token(&local_1f0,NewLine,local_228,0);
LAB_001944c1:
  _Var26._M_p = (pointer)(local_d0 + (local_d0 != pbVar23));
  if ((byte *)_Var26._M_p == pbVar23) goto LAB_001947e4;
  goto LAB_00192b2f;
}

Assistant:

std::shared_ptr<TokenStream> TokenStream::tokenize(ProgramContext& program, std::string data_, const char* stream_name)
{
    LexerContext lexer(program, std::move(data_), stream_name);

    auto begin = lexer.stream.data.c_str();
    auto end = lexer.stream.data.c_str() + lexer.stream.data.size();

    for(auto it = begin; it != end; )
    {
        const char *line_start = it;
        const char *line_end   = std::find(it, end, '\n');

        lex_line(lexer, begin, std::distance(begin, line_start), std::distance(begin, line_end));
        it = (line_end == end? line_end : std::next(line_end));
    }

    lexer.verify_nesting();

    if(!lexer.any_error)
        return shared_ptr<TokenStream>(new TokenStream(program, std::move(lexer.stream), std::move(lexer.tokens)));
    else
        return nullptr;
}